

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagelist.cc
# Opt level: O3

shared_ptr<const_rcg::Image> __thiscall
rcg::ImageList::find(ImageList *this,uint64_t timestamp,uint64_t tolerance)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  ulong uVar3;
  pointer psVar4;
  ulong in_RCX;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  shared_ptr<const_rcg::Image> sVar12;
  
  plVar2 = *(long **)(timestamp + 8);
  lVar6 = *(long *)(timestamp + 0x10) - (long)plVar2;
  if (lVar6 != 0) {
    if (in_RCX == 0) {
      sVar12 = find(this,timestamp);
      tolerance = (uint64_t)
                  sVar12.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      goto LAB_0011f58b;
    }
    uVar7 = lVar6 >> 4;
    uVar5 = *(ulong *)(*plVar2 + 8);
    uVar9 = uVar5 - tolerance;
    if (uVar5 < tolerance) {
      uVar9 = -(uVar5 - tolerance);
    }
    if (uVar7 < 2) {
      uVar5 = 0;
    }
    else {
      uVar11 = 1;
      uVar5 = 0;
      plVar10 = plVar2;
      do {
        plVar10 = plVar10 + 2;
        uVar3 = *(ulong *)(*plVar10 + 8);
        uVar8 = uVar3 - tolerance;
        if (uVar3 < tolerance) {
          uVar8 = -(uVar3 - tolerance);
        }
        if (uVar8 < uVar9) {
          uVar5 = uVar11;
          uVar9 = uVar8;
        }
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    if (uVar9 < in_RCX) {
      this->maxsize = plVar2[uVar5 * 2];
      psVar4 = (pointer)plVar2[uVar5 * 2 + 1];
      (this->list).
      super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar4;
      if (psVar4 != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(psVar4->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = &(psVar4->super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount;
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
      goto LAB_0011f58b;
    }
  }
  this->maxsize = 0;
  (this->list).
  super__Vector_base<std::shared_ptr<const_rcg::Image>,_std::allocator<std::shared_ptr<const_rcg::Image>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0011f58b:
  sVar12.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)tolerance;
  sVar12.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_rcg::Image>)
         sVar12.super___shared_ptr<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Image> ImageList::find(uint64_t timestamp, uint64_t tolerance) const
{
  if (list.size() > 0)
  {
    if (tolerance > 0)
    {
      size_t min_i=0;
      uint64_t min_ad=absDiff(list[0]->getTimestampNS(), timestamp);

      for (size_t i=1; i<list.size(); i++)
      {
        uint64_t ad=absDiff(list[i]->getTimestampNS(), timestamp);

        if (ad < min_ad)
        {
          min_i=i;
          min_ad=ad;
        }
      }

      if (min_ad < tolerance)
      {
        return list[min_i];
      }
    }
    else
    {
      return find(timestamp);
    }
  }

  return std::shared_ptr<const Image>();
}